

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem.c
# Opt level: O0

coda_dynamic_type * coda_mem_empty_record(coda_format format)

{
  long lVar1;
  coda_type_record *definition;
  coda_mem_record *pcVar2;
  coda_format format_local;
  
  if ((coda_format_rinex|coda_format_xml) < format) {
    __assert_fail("format < num_empty_record_singletons",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem.c"
                  ,0x31,"coda_dynamic_type *coda_mem_empty_record(coda_format)");
  }
  lVar1 = __tls_get_addr(&PTR_00246d10);
  if (*(long *)(lVar1 + 0x1060 + (ulong)format * 8) == 0) {
    definition = coda_type_empty_record(format);
    pcVar2 = coda_mem_record_new(definition,(coda_dynamic_type *)0x0);
    lVar1 = __tls_get_addr(&PTR_00246d10);
    *(coda_mem_record **)(lVar1 + 0x1060 + (ulong)format * 8) = pcVar2;
    lVar1 = __tls_get_addr(&PTR_00246d10);
    if (*(long *)(lVar1 + 0x1060 + (ulong)format * 8) == 0) {
      __assert_fail("empty_record_singleton[format] != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem.c"
                    ,0x35,"coda_dynamic_type *coda_mem_empty_record(coda_format)");
    }
  }
  lVar1 = __tls_get_addr(&PTR_00246d10);
  return *(coda_dynamic_type **)(lVar1 + 0x1060 + (ulong)format * 8);
}

Assistant:

coda_dynamic_type *coda_mem_empty_record(coda_format format)
{
    assert(format < num_empty_record_singletons);
    if (empty_record_singleton[format] == NULL)
    {
        empty_record_singleton[format] = coda_mem_record_new(coda_type_empty_record(format), NULL);
        assert(empty_record_singleton[format] != NULL);
    }

    return (coda_dynamic_type *)empty_record_singleton[format];
}